

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O3

Type __thiscall
soplex::
LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::type(LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this,int i)

{
  double a;
  pointer pnVar1;
  pointer pnVar2;
  int iVar3;
  Type TVar4;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  long in_FS_OFFSET;
  cpp_dec_float<200U,_int,_void> local_a8;
  
  pcVar5 = &(this->right).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 0x1c;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems[6] = 0;
  local_a8.data._M_elems[7] = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.data._M_elems[10] = 0;
  local_a8.data._M_elems[0xb] = 0;
  local_a8.data._M_elems[0xc] = 0;
  local_a8.data._M_elems[0xd] = 0;
  local_a8.data._M_elems[0xe] = 0;
  local_a8.data._M_elems[0xf] = 0;
  local_a8.data._M_elems[0x10] = 0;
  local_a8.data._M_elems[0x11] = 0;
  local_a8.data._M_elems[0x12] = 0;
  local_a8.data._M_elems[0x13] = 0;
  local_a8.data._M_elems[0x14] = 0;
  local_a8.data._M_elems[0x15] = 0;
  local_a8.data._M_elems[0x16] = 0;
  local_a8.data._M_elems[0x17] = 0;
  local_a8.data._M_elems[0x18] = 0;
  local_a8.data._M_elems[0x19] = 0;
  local_a8.data._M_elems._104_5_ = 0;
  local_a8.data._M_elems[0x1b]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_a8,a);
  if (((pcVar5->fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
     (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (pcVar5,&local_a8), -1 < iVar3)) {
    return GREATER_EQUAL;
  }
  pcVar5 = &(this->left).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  ::soplex::infinity::__tls_init();
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 0x1c;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems[6] = 0;
  local_a8.data._M_elems[7] = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.data._M_elems[10] = 0;
  local_a8.data._M_elems[0xb] = 0;
  local_a8.data._M_elems[0xc] = 0;
  local_a8.data._M_elems[0xd] = 0;
  local_a8.data._M_elems[0xe] = 0;
  local_a8.data._M_elems[0xf] = 0;
  local_a8.data._M_elems[0x10] = 0;
  local_a8.data._M_elems[0x11] = 0;
  local_a8.data._M_elems[0x12] = 0;
  local_a8.data._M_elems[0x13] = 0;
  local_a8.data._M_elems[0x14] = 0;
  local_a8.data._M_elems[0x15] = 0;
  local_a8.data._M_elems[0x16] = 0;
  local_a8.data._M_elems[0x17] = 0;
  local_a8.data._M_elems[0x18] = 0;
  local_a8.data._M_elems[0x19] = 0;
  local_a8.data._M_elems._104_5_ = 0;
  local_a8.data._M_elems[0x1b]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_a8,-a);
  if (((pcVar5->fpclass == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
     (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (pcVar5,&local_a8), 0 < iVar3)) {
    pnVar1 = (this->left).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    TVar4 = RANGE;
    if ((pnVar1[i].m_backend.fpclass != cpp_dec_float_NaN) &&
       (pnVar2 = (this->right).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       pnVar2[i].m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&pnVar1[i].m_backend,&pnVar2[i].m_backend);
      TVar4 = (uint)(iVar3 != 0) * 2 + EQUAL;
    }
  }
  else {
    TVar4 = LESS_EQUAL;
  }
  return TVar4;
}

Assistant:

typename LPRowBase<R>::Type type(int i) const
   {
      if(rhs(i) >= R(infinity))
         return LPRowBase<R>::GREATER_EQUAL;

      if(lhs(i) <= R(-infinity))
         return LPRowBase<R>::LESS_EQUAL;

      if(lhs(i) == rhs(i))
         return LPRowBase<R>::EQUAL;

      return LPRowBase<R>::RANGE;
   }